

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void __thiscall Fl_Window::fullscreen_x(Fl_Window *this)

{
  byte *pbVar1;
  int iVar2;
  Window WVar3;
  
  iVar2 = Fl_X::ewmh_supported();
  if (iVar2 != 0) {
    if ((fullscreen_screen_top | fullscreen_screen_bottom | fullscreen_screen_left |
        fullscreen_screen_right) < 0) {
      Fl::screen_num((this->super_Fl_Group).super_Fl_Widget.x_,
                     (this->super_Fl_Group).super_Fl_Widget.y_,
                     (this->super_Fl_Group).super_Fl_Widget.w_,
                     (this->super_Fl_Group).super_Fl_Widget.h_);
    }
    WVar3 = 0;
    XSendEvent(fl_display,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),0,
               0x180000);
    if (this->i != (Fl_X *)0x0) {
      WVar3 = this->i->xid;
    }
    send_wm_state_event(WVar3,1,fl_NET_WM_STATE_FULLSCREEN);
    return;
  }
  pbVar1 = (byte *)((long)&(this->super_Fl_Group).super_Fl_Widget.flags_ + 2);
  *pbVar1 = *pbVar1 | 4;
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])(this);
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
  if (this->i == (Fl_X *)0x0) {
    WVar3 = 0;
  }
  else {
    WVar3 = this->i->xid;
  }
  XGrabKeyboard(fl_display,WVar3,1,1,1,fl_event_time);
  Fl::handle(0x19,this);
  return;
}

Assistant:

void Fl_Window::fullscreen_x() {
  if (Fl_X::ewmh_supported()) {
    int top, bottom, left, right;

    top = fullscreen_screen_top;
    bottom = fullscreen_screen_bottom;
    left = fullscreen_screen_left;
    right = fullscreen_screen_right;

    if ((top < 0) || (bottom < 0) || (left < 0) || (right < 0)) {
      top = Fl::screen_num(x(), y(), w(), h());
      bottom = top;
      left = top;
      right = top;
    }

    send_wm_event(fl_xid(this), fl_NET_WM_FULLSCREEN_MONITORS,
                  top, bottom, left, right);
    send_wm_state_event(fl_xid(this), 1, fl_NET_WM_STATE_FULLSCREEN);
  } else {
    _set_fullscreen();
    hide();
    show();
    /* We want to grab the window, not a widget, so we cannot use Fl::grab */
    XGrabKeyboard(fl_display, fl_xid(this), 1, GrabModeAsync, GrabModeAsync, fl_event_time);
    Fl::handle(FL_FULLSCREEN, this);
  }
}